

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_namespace::statement_namespace
          (statement_namespace *this,token_base *tbp,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *block,context_t *c,
          token_base *ptr)

{
  var_id *this_00;
  string *psVar1;
  token_base *in_RCX;
  context_t *in_RDX;
  token_id *in_RSI;
  undefined8 *in_RDI;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff88;
  statement_base *this_01;
  statement_base local_38;
  token_id *local_10;
  
  this_01 = &local_38;
  local_10 = in_RSI;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_RCX,
             (shared_ptr<cs::context_type> *)in_stack_ffffffffffffff88);
  statement_base::statement_base(this_01,in_RDX,in_RCX);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x2421c6);
  *in_RDI = &PTR__statement_namespace_003be398;
  this_00 = token_id::get_id(local_10);
  psVar1 = var_id::operator_cast_to_string_(this_00);
  std::__cxx11::string::string((string *)(in_RDI + 4),(string *)psVar1);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RCX,
             in_stack_ffffffffffffff88);
  return;
}

Assistant:

statement_namespace(token_base *tbp, std::deque<statement_base *> block, context_t c, token_base *ptr)
			: statement_base(std::move(c), ptr), mName(static_cast<token_id *>(tbp)->get_id()),
			  mBlock(std::move(block)) {}